

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O2

void cfl_luma_subsampling_420_lbd_avx2
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [32];
  undefined1 auVar4 [32];
  
  pauVar3 = (undefined1 (*) [32])(pred_buf_q3 + (ulong)(width & 0xfffffffe) * 0x10);
  auVar4[8] = 2;
  auVar4._0_8_ = 0x202020202020202;
  auVar4[9] = 2;
  auVar4[10] = 2;
  auVar4[0xb] = 2;
  auVar4[0xc] = 2;
  auVar4[0xd] = 2;
  auVar4[0xe] = 2;
  auVar4[0xf] = 2;
  auVar4[0x10] = 2;
  auVar4[0x11] = 2;
  auVar4[0x12] = 2;
  auVar4[0x13] = 2;
  auVar4[0x14] = 2;
  auVar4[0x15] = 2;
  auVar4[0x16] = 2;
  auVar4[0x17] = 2;
  auVar4[0x18] = 2;
  auVar4[0x19] = 2;
  auVar4[0x1a] = 2;
  auVar4[0x1b] = 2;
  auVar4[0x1c] = 2;
  auVar4[0x1d] = 2;
  auVar4[0x1e] = 2;
  auVar4[0x1f] = 2;
  do {
    auVar1 = vpmaddubsw_avx2(*(undefined1 (*) [32])input,auVar4);
    auVar2 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])input + input_stride),
                             auVar4);
    auVar1 = vpaddw_avx2(auVar2,auVar1);
    *(undefined1 (*) [32])pred_buf_q3 = auVar1;
    input = *(undefined1 (*) [32])input + input_stride * 2;
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
  } while (pred_buf_q3 < pauVar3);
  return;
}

Assistant:

static void cfl_luma_subsampling_420_lbd_avx2(const uint8_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;                               // Forever 32
  const __m256i twos = _mm256_set1_epi8(2);  // Thirty two twos
  const int luma_stride = input_stride << 1;
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + (height >> 1) * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i bot = _mm256_loadu_si256((__m256i *)(input + input_stride));

    __m256i top_16x16 = _mm256_maddubs_epi16(top, twos);
    __m256i bot_16x16 = _mm256_maddubs_epi16(bot, twos);
    __m256i sum_16x16 = _mm256_add_epi16(top_16x16, bot_16x16);

    _mm256_storeu_si256(row, sum_16x16);

    input += luma_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}